

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_buffered_region.h
# Opt level: O2

void __thiscall
S2ShapeIndexBufferedRegion::S2ShapeIndexBufferedRegion
          (S2ShapeIndexBufferedRegion *this,S2ShapeIndex *index,S1ChordAngle radius)

{
  S1ChordAngle SVar1;
  S1ChordAngle local_40;
  Options local_38;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2ShapeIndexBufferedRegion_003060b8;
  (this->radius_).length2_ = radius.length2_;
  local_40.length2_ = radius.length2_;
  SVar1 = S1ChordAngle::Successor(&local_40);
  (this->radius_successor_).length2_ = SVar1.length2_;
  local_38.max_distance_.super_S1ChordAngle.length2_ = (S1ChordAngle)0.0;
  local_38.max_error_.length2_ = 0.0;
  local_38.max_results_ = 0;
  local_38.include_interiors_ = false;
  local_38.use_brute_force_ = false;
  local_38._22_2_ = 0;
  S2ClosestEdgeQueryBase<S2MinDistance>::Options::Options(&local_38);
  S2ClosestEdgeQuery::S2ClosestEdgeQuery(&this->query_,index,(Options *)&local_38);
  (this->query_).options_.super_Options.include_interiors_ = true;
  return;
}

Assistant:

inline S2ShapeIndexBufferedRegion::S2ShapeIndexBufferedRegion(
    const S2ShapeIndex* index, S1ChordAngle radius)
    : radius_(radius), radius_successor_(radius.Successor()), query_(index) {
  query_.mutable_options()->set_include_interiors(true);
}